

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

nng_err http_copy_data(nni_http_entity *entity,void *data,size_t size)

{
  nng_err nVar1;
  void *data_00;
  
  data_00 = nni_zalloc(size);
  if (data_00 == (void *)0x0) {
    nVar1 = NNG_ENOMEM;
  }
  else {
    http_set_data(entity,data_00,size);
    entity->own = true;
    memcpy(entity->data,data,size);
    nVar1 = NNG_OK;
  }
  return nVar1;
}

Assistant:

static nng_err
http_copy_data(nni_http_entity *entity, const void *data, size_t size)
{
	nng_err rv;
	if ((rv = http_alloc_data(entity, size)) == 0) {
		memcpy(entity->data, data, size);
	}
	return (rv);
}